

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

XML_Convert_Result
latin1_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  byte bVar1;
  byte *pbVar2;
  ushort *puVar3;
  bool bVar4;
  unsigned_short *toLim_local;
  unsigned_short **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  while( true ) {
    bVar4 = false;
    if (*fromP < fromLim) {
      bVar4 = *toP < toLim;
    }
    if (!bVar4) break;
    pbVar2 = (byte *)*fromP;
    *fromP = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    puVar3 = *toP;
    *toP = puVar3 + 1;
    *puVar3 = (ushort)bVar1;
  }
  if ((*toP == toLim) && (*fromP < fromLim)) {
    enc_local._4_4_ = XML_CONVERT_OUTPUT_EXHAUSTED;
  }
  else {
    enc_local._4_4_ = XML_CONVERT_COMPLETED;
  }
  return enc_local._4_4_;
}

Assistant:

static enum XML_Convert_Result PTRCALL
latin1_toUtf16(const ENCODING *enc, const char **fromP, const char *fromLim,
               unsigned short **toP, const unsigned short *toLim) {
  UNUSED_P(enc);
  while (*fromP < fromLim && *toP < toLim)
    *(*toP)++ = (unsigned char)*(*fromP)++;

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}